

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O0

ssize_t __thiscall inja::Environment::write(Environment *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  string local_2a8;
  path local_278;
  path local_250;
  undefined1 local_228 [8];
  ofstream file;
  string *filename_out_local;
  json *data_local;
  path *filename_local;
  Environment *this_local;
  
  ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_278,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__n,
             auto_format);
  std::filesystem::__cxx11::operator/(&local_250,&this->output_path,&local_278);
  ::std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ofstream *)local_228,&local_250,_S_out);
  std::filesystem::__cxx11::path::~path(&local_250);
  std::filesystem::__cxx11::path::~path(&local_278);
  render_file(&local_2a8,this,(path *)CONCAT44(in_register_00000034,__fd),(json *)__buf);
  ::std::operator<<((ostream *)local_228,(string *)&local_2a8);
  ::std::__cxx11::string::~string((string *)&local_2a8);
  ::std::ofstream::close();
  sVar1 = ::std::ofstream::~ofstream(local_228);
  return sVar1;
}

Assistant:

void write(const std::filesystem::path& filename, const json& data, const std::string& filename_out) {
    std::ofstream file(output_path / filename_out);
    file << render_file(filename, data);
    file.close();
  }